

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O2

Fluid_Image * Fluid_Image::find(char *iname)

{
  Fl_Shared_Image *pFVar1;
  int iVar2;
  Fluid_Image **ppFVar3;
  int iVar4;
  FILE *__stream;
  Fluid_Image *pFVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  long lVar9;
  
  ppFVar3 = images;
  if ((iname != (char *)0x0) && (uVar11 = 0, uVar10 = numimages, *iname != '\0')) {
    while (uVar12 = uVar10, (int)uVar11 < (int)uVar12) {
      uVar10 = uVar11 + uVar12 >> 1;
      pFVar5 = ppFVar3[uVar10];
      iVar4 = strcmp(iname,pFVar5->name_);
      if (-1 < iVar4) {
        if (iVar4 == 0) {
          return pFVar5;
        }
        uVar11 = uVar10 + 1;
        uVar10 = uVar12;
      }
    }
    goto_source_dir();
    __stream = (FILE *)fl_fopen(iname,"rb");
    if (__stream == (FILE *)0x0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      read_error("%s : %s",iname,pcVar7);
      leave_source_dir();
      return (Fluid_Image *)0x0;
    }
    fclose(__stream);
    pFVar5 = (Fluid_Image *)operator_new(0x28);
    Fluid_Image(pFVar5,iname);
    pFVar1 = pFVar5->img;
    if (((pFVar1 == (Fl_Shared_Image *)0x0) || ((pFVar1->super_Fl_Image).w_ == 0)) ||
       ((pFVar1->super_Fl_Image).h_ == 0)) {
      ~Fluid_Image(pFVar5);
      operator_delete(pFVar5,0x28);
      pFVar5 = (Fluid_Image *)0x0;
      read_error("%s : unrecognized image format",iname);
    }
    leave_source_dir();
    if (pFVar5 != (Fluid_Image *)0x0) {
      iVar4 = numimages + 1;
      bVar13 = tablesize <= numimages;
      numimages = iVar4;
      if (bVar13) {
        iVar2 = tablesize * 2;
        bVar13 = tablesize != 0;
        tablesize = 0x10;
        if (bVar13) {
          tablesize = iVar2;
        }
        if (images == (Fluid_Image **)0x0) {
          images = (Fluid_Image **)malloc((long)tablesize << 3);
        }
        else {
          images = (Fluid_Image **)realloc(images,(long)tablesize << 3);
        }
      }
      ppFVar3 = images;
      lVar9 = (long)iVar4;
      while (lVar8 = lVar9 + -1, (long)(ulong)uVar11 < lVar8) {
        ppFVar3[lVar8] = ppFVar3[lVar9 + -2];
        lVar9 = lVar8;
      }
      ppFVar3[uVar11] = pFVar5;
      return pFVar5;
    }
  }
  return (Fluid_Image *)0x0;
}

Assistant:

Fluid_Image* Fluid_Image::find(const char *iname) {
  if (!iname || !*iname) return 0;

  // first search to see if it exists already:
  int a = 0;
  int b = numimages;
  while (a < b) {
    int c = (a+b)/2;
    int i = strcmp(iname,images[c]->name_);
    if (i < 0) b = c;
    else if (i > 0) a = c+1;
    else return images[c];
  }

  // no, so now see if the file exists:

  goto_source_dir();
  FILE *f = fl_fopen(iname,"rb");
  if (!f) {
    read_error("%s : %s",iname,strerror(errno));
    leave_source_dir();
    return 0;
  }
  fclose(f);

  Fluid_Image *ret = new Fluid_Image(iname);

  if (!ret->img || !ret->img->w() || !ret->img->h()) {
    delete ret;
    ret = 0;
    read_error("%s : unrecognized image format", iname);
  }
  leave_source_dir();
  if (!ret) return 0;

  // make a new entry in the table:
  numimages++;
  if (numimages > tablesize) {
    tablesize = tablesize ? 2*tablesize : 16;
    if (images) images = (Fluid_Image**)realloc(images, tablesize*sizeof(Fluid_Image*));
    else images = (Fluid_Image**)malloc(tablesize*sizeof(Fluid_Image*));
  }
  for (b = numimages-1; b > a; b--) images[b] = images[b-1];
  images[a] = ret;

  return ret;
}